

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O3

void __thiscall EditDistance::updateDpMatrix(EditDistance *this,int upperBound)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int j;
  int iVar7;
  
  uVar3 = (ulong)this->seqSize;
  if ((long)uVar3 < 1) {
    iVar4 = 0;
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    iVar4 = 0;
    do {
      lVar1 = *(long *)((long)&this->seq1->var + lVar6);
      if (((*(int *)(lVar1 + 0xc) < 1) && (-1 < *(int *)(lVar1 + 0x10))) &&
         ((*(char **)(lVar1 + 0x28) == (char *)0x0 || (**(char **)(lVar1 + 0x28) != '\0')))) {
        iVar5 = iVar5 + 1;
      }
      lVar1 = *(long *)((long)&this->seq2->var + lVar6);
      if (((*(int *)(lVar1 + 0xc) < 1) && (-1 < *(int *)(lVar1 + 0x10))) &&
         ((*(char **)(lVar1 + 0x28) == (char *)0x0 || (**(char **)(lVar1 + 0x28) != '\0')))) {
        iVar4 = iVar4 + 1;
      }
      lVar6 = lVar6 + 0x10;
    } while (uVar3 << 4 != lVar6);
  }
  if (iVar4 < iVar5) {
    iVar4 = iVar5;
  }
  if (-1 < this->seqSize) {
    iVar4 = upperBound / this->min_id_cost + iVar4;
    iVar5 = 0;
    do {
      j = iVar5 - iVar4;
      if (j < 1) {
        j = 0;
      }
      iVar7 = iVar5 + iVar4;
      if ((int)uVar3 <= iVar5 + iVar4) {
        iVar7 = (int)uVar3;
      }
      if (j <= iVar7) {
        do {
          updateDpPosition(this,iVar5,j,iVar4);
          bVar2 = j < iVar7;
          j = j + 1;
        } while (bVar2);
        uVar3 = (ulong)(uint)this->seqSize;
      }
      bVar2 = iVar5 < (int)uVar3;
      iVar5 = iVar5 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void updateDpMatrix(int upperBound) {
		//
		// First update regular matrix
		//

		// count num possible 0 insertions
		int possible_0_inserts = 0;
		int possible_0_deletes = 0;
		for (int i = 0; i < seqSize; i++) {
			if (seq1[i].indomain(0)) {
				possible_0_inserts++;
			}
			if (seq2[i].indomain(0)) {
				possible_0_deletes++;
			}
		}

		// d = distance to diagonal that should be calculated in the matrix
		const int d = upperBound / min_id_cost + std::max(possible_0_inserts, possible_0_deletes);

#ifndef NDEBUG
		std::cout << "d = " << d << '\n';
#endif

		for (int i = 0; i < seqSize + 1; i++) {
			const int startCol = std::max(0, i - d);
			const int endCol = std::min(seqSize, i + d);
			for (int j = startCol; j < endCol + 1; j++) {
				updateDpPosition(i, j, d);
			}
		}
	}